

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_NodeCollect_rec(Gia_Man_t *p,Gia_Obj_t *pNode,Vec_Int_t *vSupp)

{
  int iVar1;
  uint uVar2;
  
  while( true ) {
    iVar1 = Gia_ObjIsTravIdCurrent(p,pNode);
    if (iVar1 != 0) {
      return;
    }
    Gia_ObjSetTravIdCurrent(p,pNode);
    iVar1 = Gia_ObjRefNum(p,pNode);
    if ((iVar1 != 0) || (uVar2 = (uint)*(undefined8 *)pNode, (~uVar2 & 0x9fffffff) == 0)) break;
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaUtil.c"
                    ,0x4c1,"void Gia_NodeCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    Gia_NodeCollect_rec(p,pNode + -(ulong)(uVar2 & 0x1fffffff),vSupp);
    pNode = pNode + -(ulong)(*(uint *)&pNode->field_0x4 & 0x1fffffff);
  }
  iVar1 = Gia_ObjId(p,pNode);
  Vec_IntPush(vSupp,iVar1);
  return;
}

Assistant:

void Gia_NodeCollect_rec( Gia_Man_t * p, Gia_Obj_t * pNode, Vec_Int_t * vSupp )
{
    if ( Gia_ObjIsTravIdCurrent(p, pNode) )
        return;
    Gia_ObjSetTravIdCurrent(p, pNode);
    if ( Gia_ObjRefNum(p, pNode) || Gia_ObjIsCi(pNode) )
    {
        Vec_IntPush( vSupp, Gia_ObjId(p, pNode) );
        return;
    }
    assert( Gia_ObjIsAnd(pNode) );
    Gia_NodeCollect_rec( p, Gia_ObjFanin0(pNode), vSupp );
    Gia_NodeCollect_rec( p, Gia_ObjFanin1(pNode), vSupp );
}